

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinetic.c
# Opt level: O2

void reactname(Item *q1,Item *lastok,Item *q2)

{
  Symbol *s;
  int iVar1;
  Rterm *pRVar2;
  Symbol *pSVar3;
  ulong uVar4;
  char *pcVar5;
  Rterm *pRVar6;
  
  pRVar6 = rterm;
  pRVar2 = (Rterm *)emalloc(0x20);
  rterm = pRVar2;
  pRVar2->rnext = pRVar6;
  pRVar2->isstate = 0;
  s = (q1->element).sym;
  uVar4 = s->subtype;
  if ((uVar4 & 0x10) != 0) {
    iVar1 = in_solvefor(s);
    if (iVar1 != 0) {
      sprintf(buf,"D%s",s->name);
      pSVar3 = lookup(buf);
      *(byte *)&pSVar3->usage = (byte)pSVar3->usage | 8;
      s->used = s->used + 1;
      rterm->isstate = 1;
      goto LAB_0010c2cc;
    }
    uVar4 = s->subtype;
  }
  if ((uVar4 & 0x8201e) == 0) {
    diag(s->name," must be a STATE, CONSTANT, ASSIGNED, STEPPED, or INDEPENDENT");
  }
LAB_0010c2cc:
  if (q2 == (Item *)0x0) {
    iVar1 = 1;
  }
  else {
    iVar1 = atoi((q2->element).str);
  }
  pRVar6 = rterm;
  rterm->num = iVar1;
  if (q1 == lastok) {
    pcVar5 = (char *)0x0;
  }
  else {
    if ((s->subtype & 0x20) == 0) {
      diag("REACTION: MUST be scalar or array",(char *)0x0);
    }
    pcVar5 = qconcat(q1->next->next,lastok->prev);
    pRVar6 = rterm;
  }
  pRVar6->str = pcVar5;
  pRVar6->sym = s;
  return;
}

Assistant:

void reactname(q1, lastok, q2) /* NAME [] INTEGER   q2 may be null*/
	Item *q1, *lastok, *q2;
{	/* put on right hand side */
	Symbol *s, *s1;
	Rterm *rnext;

	rnext = rterm;
	rterm = (Rterm *)emalloc(sizeof(Rterm));
	rterm->rnext = rnext;
	rterm->isstate = 0;
	s = SYM(q1);
	if ((s->subtype & STAT) && in_solvefor(s)) {
		Sprintf(buf, "D%s", s->name);
		s1 = lookup(buf);
		s1->usage |= DEP;
		s->used++;
		rterm->isstate = 1;
	} else if (!(s->subtype & (DEP | nmodlCONST | PARM | INDEP | STEP1 | STAT)) ) {
diag(s->name, " must be a STATE, CONSTANT, ASSIGNED, STEPPED, or INDEPENDENT");
	}
	if (q2) {
		rterm->num = atoi(STR(q2));
	}else{
		rterm->num = 1;
	}
	if (q1 != lastok) {
		if(!(s->subtype & ARRAY)) {
			diag("REACTION: MUST be scalar or array", (char *)0);
		}
		rterm->str = qconcat(q1->next->next, lastok->prev);
/* one too many parentheses since normally a *( is prepended to the name
during output in cout.c.  Therefore when used to construct a MATELM or RHS
extra parentheses must be prepended as in MATELM((...,(....
*/ /* this no longer holds, no parentheses are to be prepended */
	} else {
		rterm->str = (char *)0;
	}
	rterm->sym = s;
}